

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

lua_Integer luaL_checkinteger(lua_State *L,int idx)

{
  int iVar1;
  double local_30;
  lua_Number n;
  TValue tmp;
  cTValue *o;
  lua_State *plStack_10;
  int idx_local;
  lua_State *L_local;
  
  o._4_4_ = idx;
  plStack_10 = L;
  tmp = (TValue)index2adr(L,idx);
  if ((uint)((int)(*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)tmp).it >> 0xf) < 0xfffffff2) {
    local_30 = *(double *)tmp;
LAB_0011494a:
    return (long)local_30;
  }
  if ((int)(*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)tmp).it >> 0xf == -5) {
    iVar1 = lj_strscan_num((GCstr *)(*(ulong *)tmp & 0x7fffffffffff),(TValue *)&n);
    if (iVar1 != 0) {
      local_30 = n;
      goto LAB_0011494a;
    }
  }
  lj_err_argt(plStack_10,o._4_4_,3);
}

Assistant:

LUALIB_API lua_Integer luaL_checkinteger(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  lua_Number n;
  if (LJ_LIKELY(tvisint(o))) {
    return intV(o);
  } else if (LJ_LIKELY(tvisnum(o))) {
    n = numV(o);
  } else {
    if (!(tvisstr(o) && lj_strscan_number(strV(o), &tmp)))
      lj_err_argt(L, idx, LUA_TNUMBER);
    if (tvisint(&tmp))
      return (lua_Integer)intV(&tmp);
    n = numV(&tmp);
  }
#if LJ_64
  return (lua_Integer)n;
#else
  return lj_num2int(n);
#endif
}